

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

sftp_request * fxp_open_send(char *path,int type,fxp_attrs *attrs)

{
  fxp_attrs attrs_00;
  sftp_request *psVar1;
  sftp_packet *pkt;
  BinarySink *bs;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  unsigned_long local_38;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(3);
  bs = pkt->binarysink_;
  BinarySink_put_uint32(bs,(ulong)psVar1->id);
  BinarySink_put_stringz(bs,path);
  BinarySink_put_uint32(bs,(long)type);
  if (attrs == (fxp_attrs *)0x0) {
    local_38 = 0;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
  }
  else {
    local_38 = attrs->mtime;
    uVar2 = (undefined4)attrs->flags;
    uVar3 = *(undefined4 *)((long)&attrs->flags + 4);
    uVar4 = (undefined4)attrs->size;
    uVar5 = *(undefined4 *)((long)&attrs->size + 4);
    uVar6 = (undefined4)attrs->uid;
    uVar7 = *(undefined4 *)((long)&attrs->uid + 4);
    uVar8 = (undefined4)attrs->gid;
    uVar9 = *(undefined4 *)((long)&attrs->gid + 4);
    uVar10 = (undefined4)attrs->permissions;
    uVar11 = *(undefined4 *)((long)&attrs->permissions + 4);
    uVar12 = (undefined4)attrs->atime;
    uVar13 = *(undefined4 *)((long)&attrs->atime + 4);
  }
  attrs_00.flags._4_4_ = uVar3;
  attrs_00.flags._0_4_ = uVar2;
  attrs_00.size._4_4_ = uVar5;
  attrs_00.size._0_4_ = uVar4;
  attrs_00.uid._4_4_ = uVar7;
  attrs_00.uid._0_4_ = uVar6;
  attrs_00.gid._4_4_ = uVar9;
  attrs_00.gid._0_4_ = uVar8;
  attrs_00.permissions._4_4_ = uVar11;
  attrs_00.permissions._0_4_ = uVar10;
  attrs_00.atime._4_4_ = uVar13;
  attrs_00.atime._0_4_ = uVar12;
  attrs_00.mtime = local_38;
  BinarySink_put_fxp_attrs(bs,attrs_00);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_open_send(const char *path, int type,
                                   const struct fxp_attrs *attrs)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_OPEN);
    put_uint32(pktout, req->id);
    put_stringz(pktout, path);
    put_uint32(pktout, type);
    put_fxp_attrs(pktout, attrs ? *attrs : no_attrs);
    sftp_send(pktout);

    return req;
}